

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void * SstFFSGetBlocksInfo(SstStream Stream,void *Variable)

{
  void *pvVar1;
  FFSVarRec_conflict pFVar2;
  undefined8 *puVar3;
  long *plVar4;
  void *in_RSI;
  SstStream in_RDI;
  size_t *Offsets;
  int i;
  int WriterRank;
  void *Ret;
  MetaArrayRec *meta_base;
  FFSVarRec_conflict VarRec;
  FFSReaderMarshalBase *Info;
  size_t *local_48;
  int local_40;
  int local_3c;
  void *local_8;
  
  pvVar1 = in_RDI->ReaderMarshalData;
  pFVar2 = LookupVarByKey(in_RDI,in_RSI);
  puVar3 = (undefined8 *)(**(long **)((long)pvVar1 + 0x20) + *pFVar2->PerWriterMetaFieldOffset);
  if (in_RDI->MinArraySetupUpcall == (MinArraySetupUpcallFunc)0x0) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = (*in_RDI->MinArraySetupUpcall)
                        (in_RDI->SetupUpcallReader,(int)*puVar3,(size_t *)puVar3[2]);
    for (local_3c = 0; local_3c < in_RDI->WriterCohortSize; local_3c = local_3c + 1) {
      plVar4 = (long *)(*(long *)(*(long *)((long)pvVar1 + 0x20) + (long)local_3c * 8) +
                       pFVar2->PerWriterMetaFieldOffset[local_3c]);
      for (local_40 = 0; (ulong)(long)local_40 < pFVar2->PerWriterBlockCount[local_3c];
          local_40 = local_40 + 1) {
        local_48 = (size_t *)0x0;
        if (plVar4[4] != 0) {
          local_48 = (size_t *)(plVar4[4] + (long)local_40 * *plVar4 * 8);
        }
        (*in_RDI->ArrayBlocksInfoUpcall)
                  (in_RDI->SetupUpcallReader,local_8,pFVar2->Type,local_3c,(int)*plVar4,
                   (size_t *)plVar4[2],local_48,(size_t *)plVar4[3]);
      }
    }
  }
  return local_8;
}

Assistant:

extern void *SstFFSGetBlocksInfo(SstStream Stream, void *Variable)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;
    FFSVarRec VarRec = LookupVarByKey(Stream, Variable);
    MetaArrayRec *meta_base = (MetaArrayRec *)(((char *)Info->MetadataBaseAddrs[0]) +
                                               VarRec->PerWriterMetaFieldOffset[0]);
    if (!Stream->MinArraySetupUpcall)
        return NULL;

    void *Ret = Stream->MinArraySetupUpcall(Stream->SetupUpcallReader, (int)meta_base->Dims,
                                            meta_base->Shape);
    for (int WriterRank = 0; WriterRank < Stream->WriterCohortSize; WriterRank++)
    {
        meta_base = (MetaArrayRec *)(((char *)Info->MetadataBaseAddrs[WriterRank]) +
                                     VarRec->PerWriterMetaFieldOffset[WriterRank]);

        for (int i = 0; i < VarRec->PerWriterBlockCount[WriterRank]; i++)
        {
            size_t *Offsets = NULL;
            if (meta_base->Offsets)
                Offsets = meta_base->Offsets + (i * meta_base->Dims);
            Stream->ArrayBlocksInfoUpcall(Stream->SetupUpcallReader, Ret, VarRec->Type, WriterRank,
                                          (int)meta_base->Dims, meta_base->Shape, Offsets,
                                          meta_base->Count);
        }
    }
    return Ret;
}